

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

deUint32 tcu::astc::anon_unknown_0::computeISERangeMax(ISEParams *iseParams)

{
  ISEMode IVar1;
  int iVar2;
  byte bVar3;
  
  IVar1 = iseParams->mode;
  if (IVar1 == ISEMODE_PLAIN_BIT) {
    return ~(-1 << ((byte)iseParams->numBits & 0x1f));
  }
  if (IVar1 == ISEMODE_QUINT) {
    bVar3 = (byte)iseParams->numBits;
    iVar2 = 5;
  }
  else {
    if (IVar1 != ISEMODE_TRIT) {
      return 0xffffffff;
    }
    bVar3 = (byte)iseParams->numBits;
    iVar2 = 3;
  }
  return (iVar2 << (bVar3 & 0x1f)) - 1;
}

Assistant:

static inline deUint32 computeISERangeMax (const ISEParams& iseParams)
{
	switch (iseParams.mode)
	{
		case ISEMODE_TRIT:			return (1u << iseParams.numBits) * 3 - 1;
		case ISEMODE_QUINT:			return (1u << iseParams.numBits) * 5 - 1;
		case ISEMODE_PLAIN_BIT:		return (1u << iseParams.numBits)     - 1;
		default:
			DE_ASSERT(false);
			return -1;
	}
}